

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::GradientFillRectDecal
          (PixelGameEngine *this,vf2d *pos,vf2d *size,Pixel colTL,Pixel colBL,Pixel colBR,
          Pixel colTR)

{
  array<olc::Pixel,_4UL> cols;
  vf2d local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  vf2d local_28;
  float local_20;
  float local_1c;
  float fStack_18;
  float fStack_14;
  float fStack_10;
  float local_c;
  
  local_28 = *pos;
  local_20 = local_28.x;
  local_c = local_28.y;
  fStack_18 = (*size).x + local_20;
  local_1c = (*size).y + local_c;
  local_38 = 0;
  uStack_30 = 0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  uStack_40 = 0;
  cols._M_elems[3] = colTR;
  cols._M_elems[0].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)colTL;
  cols._M_elems[1].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)colBL;
  cols._M_elems[2].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)colBR;
  fStack_14 = local_1c;
  fStack_10 = fStack_18;
  DrawExplicitDecal(this,(Decal *)0x0,&local_28,&local_48,cols._M_elems,4);
  return;
}

Assistant:

void PixelGameEngine::GradientFillRectDecal(const olc::vf2d& pos, const olc::vf2d& size, const olc::Pixel colTL, const olc::Pixel colBL, const olc::Pixel colBR, const olc::Pixel colTR)
	{
		std::array<olc::vf2d, 4> points = { { {pos}, {pos.x, pos.y + size.y}, {pos + size}, {pos.x + size.x, pos.y} } };
		std::array<olc::vf2d, 4> uvs = { {{0,0},{0,0},{0,0},{0,0}} };
		std::array<olc::Pixel, 4> cols = { {colTL, colBL, colBR, colTR} };
		DrawExplicitDecal(nullptr, points.data(), uvs.data(), cols.data(), 4);
	}